

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O0

bool handler_selective_new_allowed_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value *new_value)

{
  bool bVar1;
  byte bVar2;
  Am_Value *pAVar3;
  undefined1 local_90 [8];
  Am_Selective_Repeat_New_Method method;
  Am_Value local_70;
  Am_Object local_60;
  undefined4 local_58;
  undefined1 local_48 [8];
  Am_Value value;
  Am_Selective_New_Allowed_Method allowed_method;
  Am_Value *new_value_local;
  Am_Value *new_selection_local;
  Am_Object *command_obj_local;
  
  Am_Selective_New_Allowed_Method::Am_Selective_New_Allowed_Method
            ((Am_Selective_New_Allowed_Method *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_48);
  do {
    bVar1 = Am_Object::Valid(command_obj);
    if (!bVar1) {
      command_obj_local._7_1_ = false;
LAB_002482fd:
      local_58 = 1;
      Am_Value::~Am_Value((Am_Value *)local_48);
      return command_obj_local._7_1_;
    }
    pAVar3 = Am_Object::Get(command_obj,0x14d,4);
    Am_Selective_New_Allowed_Method::operator=
              ((Am_Selective_New_Allowed_Method *)&value.value,pAVar3);
    bVar1 = Am_Selective_New_Allowed_Method::Valid((Am_Selective_New_Allowed_Method *)&value.value);
    if (bVar1) {
      Am_Object::Am_Object(&local_60,command_obj);
      Am_Value::Am_Value(&local_70,new_selection);
      Am_Value::Am_Value((Am_Value *)&method.Call,new_value);
      bVar2 = (*(code *)allowed_method.from_wrapper)(&local_60,&local_70,&method.Call);
      Am_Value::~Am_Value((Am_Value *)&method.Call);
      Am_Value::~Am_Value(&local_70);
      Am_Object::~Am_Object(&local_60);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        command_obj_local._7_1_ = false;
        goto LAB_002482fd;
      }
    }
    Am_Selective_Repeat_New_Method::Am_Selective_Repeat_New_Method
              ((Am_Selective_Repeat_New_Method *)local_90);
    pAVar3 = Am_Object::Get(command_obj,0x14a,4);
    Am_Selective_Repeat_New_Method::operator=((Am_Selective_Repeat_New_Method *)local_90,pAVar3);
    bVar1 = Am_Selective_Repeat_New_Method::Valid((Am_Selective_Repeat_New_Method *)local_90);
    if (bVar1) {
      command_obj_local._7_1_ = true;
      goto LAB_002482fd;
    }
    pAVar3 = Am_Object::Peek(command_obj,0x167,4);
    Am_Value::operator=((Am_Value *)local_48,pAVar3);
    bVar1 = Am_Value::Valid((Am_Value *)local_48);
    if ((!bVar1) || (local_48._0_2_ != 0xa001)) {
      command_obj_local._7_1_ = false;
      goto LAB_002482fd;
    }
    Am_Object::operator=(command_obj,(Am_Value *)local_48);
  } while( true );
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
                 handler_selective_new_allowed,
                 (Am_Object command_obj, Am_Value new_selection,
                  Am_Value new_value))
{
  Am_Selective_New_Allowed_Method allowed_method;
  Am_Value value;
  while (true) {
    if (!command_obj.Valid())
      return false;
    allowed_method =
        command_obj.Get(Am_SELECTIVE_REPEAT_NEW_ALLOWED, Am_NO_DEPENDENCY);
    if (allowed_method.Valid())
      if (!(allowed_method.Call(command_obj, new_selection, new_value)))
        return false;
    Am_Selective_Repeat_New_Method method;
    method =
        command_obj.Get(Am_SELECTIVE_REPEAT_ON_NEW_METHOD, Am_NO_DEPENDENCY);
    if (method.Valid())
      return true;
    value = command_obj.Peek(Am_IMPLEMENTATION_CHILD, Am_NO_DEPENDENCY);
    if (value.Valid() && value.type == Am_OBJECT)
      command_obj = value;
    else
      return false;
  }
}